

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

bool anon_unknown.dwarf_263068::EncodeECPoint
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EC_GROUP *group,
               EC_POINT *p,point_conversion_form_t form)

{
  size_t sVar1;
  uchar *buf;
  size_type sVar2;
  size_t len;
  point_conversion_form_t form_local;
  EC_POINT *p_local;
  EC_GROUP *group_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  sVar1 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)p,form,(uchar *)0x0,0,(BN_CTX *)0x0);
  if (sVar1 == 0) {
    out_local._7_1_ = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,sVar1);
    buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(out);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(out);
    sVar1 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)p,form,buf,sVar2,(BN_CTX *)0x0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(out);
    if (sVar1 == sVar2) {
      out_local._7_1_ = true;
    }
    else {
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

static bool EncodeECPoint(std::vector<uint8_t> *out, const EC_GROUP *group,
                          const EC_POINT *p, point_conversion_form_t form) {
  size_t len = EC_POINT_point2oct(group, p, form, nullptr, 0, nullptr);
  if (len == 0) {
    return false;
  }

  out->resize(len);
  len = EC_POINT_point2oct(group, p, form, out->data(), out->size(), nullptr);
  if (len != out->size()) {
    return false;
  }

  return true;
}